

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QPagedPaintDevice::PdfVersion,QPdfEngine::PdfVersion>::emplace<QPdfEngine::PdfVersion_const&>
          (QHash<QPagedPaintDevice::PdfVersion,QPdfEngine::PdfVersion> *this,PdfVersion *key,
          PdfVersion *args)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_28.d = (Data *)0x0;
  }
  else {
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1->size < pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<QPdfEngine::PdfVersion_const&>(this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        local_28.d._0_4_ = *args;
        pVar2 = (piter)QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>::
                       emplace_helper<QPdfEngine::PdfVersion>
                                 ((QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> *)
                                  this,key,(PdfVersion *)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_00134041;
    }
    local_28.d = pDVar1;
    if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>::detach
            ((QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> *)this);
  pVar2 = (piter)emplace_helper<QPdfEngine::PdfVersion_const&>(this,key,args);
  QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_00134041:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }